

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O3

client * workspace_find_window_client(workspace *workspace,xcb_window_t window)

{
  client *pcVar1;
  node *pnVar2;
  
  pnVar2 = workspace->clients->head;
  while( true ) {
    if (pnVar2 == (node *)0x0) {
      return (client *)0x0;
    }
    pcVar1 = (client *)pnVar2->data;
    if ((pcVar1 != (client *)0x0) && (pcVar1->window == window)) break;
    pnVar2 = pnVar2->next;
  }
  return pcVar1;
}

Assistant:

struct client *workspace_find_window_client(const struct workspace *workspace, xcb_window_t window)
{
        LIST_FOR_EACH(workspace->clients, node)
        {
                struct client *client = get_client_from_client_node(node);

                if (client == NULL) {
                        continue;
                }

                if (client->window == window) {
                        return client;
                }
        }

        return NULL;
}